

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Program __thiscall soul::heart::Parser::parse(Parser *this)

{
  Program *this_00;
  pointer pSVar1;
  pointer pSVar2;
  bool bVar3;
  Module *newModule;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  ScannedTopLevelItem *item;
  ScannedTopLevelItem *pSVar4;
  ScannedTopLevelItem *pSVar5;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2;
  Parser *in_RSI;
  Program PVar6;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  scannedTopLevelItems;
  CodeLocation moduleLocation;
  CompileMessage local_68;
  
  checkVersionDeclaration(in_RSI);
  scannedTopLevelItems.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scannedTopLevelItems.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scannedTopLevelItems.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::reserve(&scannedTopLevelItems,0x80);
  this_00 = &in_RSI->program;
  do {
    bVar3 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&in_RSI->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x2c8da6);
    pSVar1 = scannedTopLevelItems.
             super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar4 = scannedTopLevelItems.
             super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar3) {
      for (; pSVar2 = scannedTopLevelItems.
                      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          pSVar5 = scannedTopLevelItems.
                   super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                   ._M_impl.super__Vector_impl_data._M_start, pSVar4 != pSVar1; pSVar4 = pSVar4 + 1)
      {
        parseModuleStructs(in_RSI,pSVar4);
      }
      for (; pSVar1 = scannedTopLevelItems.
                      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          pSVar4 = scannedTopLevelItems.
                   super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                   ._M_impl.super__Vector_impl_data._M_start, pSVar5 != pSVar2; pSVar5 = pSVar5 + 1)
      {
        parseFunctionDecls(in_RSI,pSVar5);
      }
      for (; pSVar2 = scannedTopLevelItems.
                      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          pSVar5 = scannedTopLevelItems.
                   super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                   ._M_impl.super__Vector_impl_data._M_start, pSVar4 != pSVar1; pSVar4 = pSVar4 + 1)
      {
        parseStateVariables(in_RSI,pSVar4);
      }
      for (; pSVar5 != pSVar2; pSVar5 = pSVar5 + 1) {
        parseModule(in_RSI,pSVar5);
      }
      Program::Program((Program *)this,this_00);
      std::
      vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
      ::~vector(&scannedTopLevelItems);
      PVar6.refHolder.object = extraout_RDX.object;
      PVar6.pimpl = (ProgramImpl *)this;
      return PVar6;
    }
    moduleLocation.sourceCode.object =
         (in_RSI->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.sourceCode.object;
    if (moduleLocation.sourceCode.object != (SourceCodeText *)0x0) {
      ((moduleLocation.sourceCode.object)->super_RefCountedObject).refCount =
           ((moduleLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    moduleLocation.location.data =
         (in_RSI->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    bVar3 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)in_RSI,"graph");
    if (bVar3) {
      newModule = Program::addGraph(this_00,-1);
LAB_00271a15:
      scanTopLevelItem(in_RSI,&moduleLocation,&scannedTopLevelItems,newModule);
    }
    else {
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)in_RSI,"processor");
      if (bVar3) {
        newModule = Program::addProcessor(this_00,-1);
        goto LAB_00271a15;
      }
      bVar3 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)in_RSI,"namespace");
      if (bVar3) {
        newModule = Program::addNamespace(this_00,-1);
        goto LAB_00271a15;
      }
      Errors::expectedTopLevelDecl<>();
      (*(in_RSI->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])();
      CompileMessage::~CompileMessage(&local_68);
    }
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&moduleLocation.sourceCode);
  } while( true );
}

Assistant:

Program parse()
    {
        checkVersionDeclaration();

        std::vector<ScannedTopLevelItem> scannedTopLevelItems;
        scannedTopLevelItems.reserve (128);

        while (! matches (Token::eof))
        {
            auto moduleLocation = location;

            if (matchIf ("graph"))              scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addGraph());
            else if (matchIf ("processor"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addProcessor());
            else if (matchIf ("namespace"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addNamespace());
            else                                throwError (Errors::expectedTopLevelDecl());
        }

        for (auto& item : scannedTopLevelItems)  parseModuleStructs (item);
        for (auto& item : scannedTopLevelItems)  parseFunctionDecls (item);
        for (auto& item : scannedTopLevelItems)  parseStateVariables (item);
        for (auto& item : scannedTopLevelItems)  parseModule (item);

        return program;
    }